

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

int __thiscall
crnlib::dynamic_string::deserialize
          (dynamic_string *this,void *pBuf,uint buf_size,bool little_endian)

{
  bool bVar1;
  uint in_EDX;
  void **in_RDI;
  uint16 l;
  uint buf_left;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  undefined2 in_stack_ffffffffffffffd8;
  ushort in_stack_ffffffffffffffda;
  uint uVar2;
  undefined4 local_4;
  
  if (in_EDX < 2) {
    local_4 = -1;
  }
  else {
    uVar2 = in_EDX;
    bVar1 = utils::read_obj<unsigned_short>
                      ((unsigned_short *)
                       CONCAT44(in_EDX,CONCAT22(in_stack_ffffffffffffffda,in_stack_ffffffffffffffd8)
                               ),in_RDI,
                       (uint *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),false);
    if (bVar1) {
      if (uVar2 < in_stack_ffffffffffffffda) {
        local_4 = -1;
      }
      else {
        set_from_buf((dynamic_string *)
                     CONCAT44(uVar2,CONCAT22(in_stack_ffffffffffffffda,in_stack_ffffffffffffffd8)),
                     in_RDI,in_stack_ffffffffffffffcc);
        local_4 = in_EDX - (uVar2 - in_stack_ffffffffffffffda);
      }
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int dynamic_string::deserialize(const void* pBuf, uint buf_size, bool little_endian) {
  uint buf_left = buf_size;

  if (buf_left < sizeof(uint16))
    return -1;

  uint16 l;
  if (!utils::read_obj(l, pBuf, buf_left, little_endian))
    return -1;

  if (buf_left < l)
    return -1;

  set_from_buf(pBuf, l);

  buf_left -= l;

  return buf_size - buf_left;
}